

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeHistogramSample>::operator=
          (CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> *this,
          CopyablePtr<perfetto::protos::gen::ChromeHistogramSample> *other)

{
  _Head_base<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_false> _Var1;
  _Head_base<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_false> _Var2;
  uint64_t uVar3;
  
  _Var1._M_head_impl =
       (other->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeHistogramSample,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
       .super__Head_base<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       (this->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeHistogramSample,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
       .super__Head_base<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->name_hash_ = (_Var1._M_head_impl)->name_hash_;
  std::__cxx11::string::_M_assign((string *)&(_Var2._M_head_impl)->name_);
  uVar3 = (_Var1._M_head_impl)->name_iid_;
  (_Var2._M_head_impl)->sample_ = (_Var1._M_head_impl)->sample_;
  (_Var2._M_head_impl)->name_iid_ = uVar3;
  std::__cxx11::string::_M_assign((string *)&(_Var2._M_head_impl)->unknown_fields_);
  ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
       (_Base_bitset<1UL>)((_Var1._M_head_impl)->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

CopyablePtr& operator=(const CopyablePtr& other) {
    *ptr_ = *other.ptr_;
    return *this;
  }